

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmLocalNinjaGenerator::~cmLocalNinjaGenerator(cmLocalNinjaGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  pointer pcVar3;
  
  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalNinjaGenerator_00632fa0;
  ppcVar2 = (this->CustomCommands).
            super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->CustomCommands).
                                  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2
                   );
  }
  std::
  _Rb_tree<const_cmCustomCommand_*,_std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>,_std::_Select1st<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>,_std::less<const_cmCustomCommand_*>,_std::allocator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>_>
  ::~_Rb_tree(&(this->CustomCommandTargets)._M_t);
  pcVar3 = (this->HomeRelativeOutputPath)._M_dataplus._M_p;
  paVar1 = &(this->HomeRelativeOutputPath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  cmLocalCommonGenerator::~cmLocalCommonGenerator(&this->super_cmLocalCommonGenerator);
  return;
}

Assistant:

cmLocalNinjaGenerator::~cmLocalNinjaGenerator() = default;